

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O0

void __thiscall BMRS_XZ<RemSP>::SecondScan(BMRS_XZ<RemSP> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint64_t *puVar6;
  uint uVar7;
  uint *puVar8;
  uint *puVar9;
  int iVar10;
  uint local_94;
  uint local_90;
  int label_1;
  unsigned_short end_pos_1;
  int k_2;
  unsigned_short start_pos_1;
  int j_1;
  uint *labels;
  int label;
  int iStack_54;
  unsigned_short end_pos;
  int k_1;
  int k;
  unsigned_short start_pos;
  int j;
  uint *labels_d;
  uint *labels_u;
  uint64_t *data_d;
  uint64_t *data_u;
  Run *pRStack_20;
  int i;
  Run *runs;
  int h;
  int w;
  BMRS_XZ<RemSP> *this_local;
  
  iVar3 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar4 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  pRStack_20 = (this->data_runs).runs;
  for (data_u._4_4_ = 0; data_u._4_4_ < iVar4 / 2; data_u._4_4_ = data_u._4_4_ + 1) {
    puVar6 = (this->data_compressed).bits;
    iVar10 = (this->data_compressed).data_width * 2 * data_u._4_4_;
    iVar5 = (this->data_compressed).data_width;
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_u._4_4_ << 1);
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_u._4_4_ * 2 + 1);
    k = 0;
    for (; uVar1 = pRStack_20->start_pos, uVar1 != 0xffff; pRStack_20 = pRStack_20 + 1) {
      uVar2 = pRStack_20->end_pos;
      uVar7 = RemSP::GetLabel(pRStack_20->label);
      for (; k < (int)(uint)uVar1; k = k + 1) {
        puVar8[k] = 0;
        puVar9[k] = 0;
      }
      for (; k < (int)(uint)uVar2; k = k + 1) {
        local_90 = uVar7;
        if ((puVar6[(long)iVar10 + (long)(k >> 6)] & 1L << ((byte)k & 0x3f)) == 0) {
          local_90 = 0;
        }
        puVar8[k] = local_90;
        local_94 = uVar7;
        if ((puVar6[(long)iVar10 + (long)iVar5 + (long)(k >> 6)] & 1L << ((byte)k & 0x3f)) == 0) {
          local_94 = 0;
        }
        puVar9[k] = local_94;
      }
    }
    for (iStack_54 = k; iStack_54 < iVar3; iStack_54 = iStack_54 + 1) {
      puVar8[iStack_54] = 0;
    }
    for (label = k; label < iVar3; label = label + 1) {
      puVar9[label] = 0;
    }
    pRStack_20 = pRStack_20 + 1;
  }
  if (iVar4 % 2 != 0) {
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,iVar4 + -1);
    k_2 = 0;
    for (; uVar1 = pRStack_20->start_pos, uVar1 != 0xffff; pRStack_20 = pRStack_20 + 1) {
      uVar2 = pRStack_20->end_pos;
      uVar7 = RemSP::GetLabel(pRStack_20->label);
      for (; k_2 < (int)(uint)uVar1; k_2 = k_2 + 1) {
        puVar8[k_2] = 0;
      }
      for (k_2 = (int)uVar1; k_2 < (int)(uint)uVar2; k_2 = k_2 + 1) {
        puVar8[k_2] = uVar7;
      }
    }
    for (label_1 = k_2; label_1 < iVar3; label_1 = label_1 + 1) {
      puVar8[label_1] = 0;
    }
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }